

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O0

void __thiscall fasttext::Vector::addRow(Vector *this,Matrix *A,int64_t i,real a)

{
  int64_t iVar1;
  int64_t iVar2;
  ulong in_RDX;
  long *in_RSI;
  Matrix *in_RDI;
  undefined4 in_XMM0_Da;
  ulong dim;
  
  if ((long)in_RDX < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/asd5510[P]fastText-chinese-word2vec-optimization/src/vector.cc"
                  ,0x37,"void fasttext::Vector::addRow(const Matrix &, int64_t, real)");
  }
  dim = in_RDX;
  iVar1 = Matrix::size(in_RDI,in_RDX);
  if ((long)dim < iVar1) {
    iVar1 = size((Vector *)0x1b3f9c);
    iVar2 = Matrix::size(in_RDI,dim);
    if (iVar1 == iVar2) {
      (**(code **)(*in_RSI + 0x28))(in_XMM0_Da,in_RSI,in_RDI,in_RDX & 0xffffffff);
      return;
    }
    __assert_fail("size() == A.size(1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/asd5510[P]fastText-chinese-word2vec-optimization/src/vector.cc"
                  ,0x39,"void fasttext::Vector::addRow(const Matrix &, int64_t, real)");
  }
  __assert_fail("i < A.size(0)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/asd5510[P]fastText-chinese-word2vec-optimization/src/vector.cc"
                ,0x38,"void fasttext::Vector::addRow(const Matrix &, int64_t, real)");
}

Assistant:

void Vector::addRow(const Matrix& A, int64_t i, real a) {
  assert(i >= 0);
  assert(i < A.size(0));
  assert(size() == A.size(1));
  A.addRowToVector(*this, i, a);
}